

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O3

void __thiscall flow::lang::Lexer::openString(Lexer *this,string *content)

{
  stringstream *this_00;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> local_40;
  string local_38;
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(this_00 + 0x10),(content->_M_dataplus)._M_p,content->_M_string_length);
  local_40._M_head_impl = (basic_istream<char,_std::char_traits<char>_> *)this_00;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"<string>","");
  enterScope(this,(unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                   *)&local_40,&local_38);
  nextToken(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_40._M_head_impl != (basic_istream<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  return;
}

Assistant:

void Lexer::openString(const std::string& content) {
  auto sstr = std::make_unique<std::stringstream>();
  (*sstr) << content;
  openStream(std::move(sstr), "<string>");
}